

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitContNew(FunctionValidator *this,ContNew *curr)

{
  Type *this_00;
  Module *pMVar1;
  ulong uVar2;
  bool bVar3;
  HeapType local_30;
  HeapType local_28;
  
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           currModule;
  if (pMVar1 == (Module *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = (bool)(*(byte *)((long)&(pMVar1->features).features + 2) & 1);
  }
  shouldBeTrue<wasm::ContNew*>
            (this,bVar3,curr,"cont.new requires stack-switching [--enable-stack-switching]");
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type.id;
  if (uVar2 != 1) {
    bVar3 = shouldBeTrue<wasm::ContNew*>
                      (this,(uVar2 & 3) == 0 && 6 < uVar2,curr,
                       "cont.new should have a non-nullable reference type");
    if (bVar3) {
      this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type;
      bVar3 = wasm::Type::isContinuation(this_00);
      if (bVar3) {
        local_28 = wasm::Type::getHeapType(this_00);
        local_30.id = (uintptr_t)HeapType::getContinuation(&local_28);
        bVar3 = HeapType::isSignature(&local_30);
      }
      else {
        bVar3 = false;
      }
      shouldBeTrue<wasm::ContNew*>
                (this,bVar3,curr,"cont.new must be annotated with a continuation type");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitContNew(ContNew* curr) {
  // TODO implement actual type-checking
  shouldBeTrue(!getModule() || getModule()->features.hasStackSwitching(),
               curr,
               "cont.new requires stack-switching [--enable-stack-switching]");

  if (curr->type == Type::unreachable) {
    return;
  }

  if (!shouldBeTrue(curr->type.isNonNullable(),
                    curr,
                    "cont.new should have a non-nullable reference type")) {
    return;
  }

  shouldBeTrue(curr->type.isContinuation() &&
                 curr->type.getHeapType().getContinuation().type.isSignature(),
               curr,
               "cont.new must be annotated with a continuation type");
}